

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinsizes.cpp
# Opt level: O2

void print_win_info(Am_Drawonable *param_1,char *param_2)

{
  return;
}

Assistant:

void
print_win_info(Am_Drawonable * /*d*/, const char * /*d_string*/)
{
  /*
  int the_left, the_top, the_width, the_height;
  const char *the_title, *the_icon_title;
  bool the_visible, the_iconified;
  Am_Style the_background;
  bool the_save_under;
  int min_w, min_h, max_w, max_h;
  bool the_no_title_bar, the_clip_by_children;
  int the_depth;

  d->Get_Values(the_left, the_top, the_width, the_height,
		the_title, the_icon_title, the_visible, the_iconified,
		the_background, the_save_under,
		min_w, min_h, max_w, max_h,
		the_no_title_bar, the_clip_by_children, the_depth);

  printf("Am_Drawonable %s:\n", d_string);
  printf(" left = %d,  top = %d,  width = %d,  height = %d,\n",
	 the_left, the_top, the_width, the_height);
  printf(" title = \"%s\",  icon_name = \"%s\",  visible = %d,  iconified = %d,\n",
	 the_title, the_icon_title, the_visible, the_iconified);
  printf(" background = %d, save_under = %d,\n",
	 (Am_Wrapper*)the_background, the_save_under);
  printf(" min_w = %d,  min_h = %d,  max_w = %d,  max_h = %d,\n",
	 min_w, min_h, max_w, max_h);
  printf(" no_title_bar = %d,  depth = %d\n\n",
	 the_no_title_bar, the_depth);
  */
}